

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# license.cpp
# Opt level: O0

void __thiscall
license::License::License(License *this,string *licenseName,string *project_folder,bool base64)

{
  string *psVar1;
  path local_b8;
  path local_98;
  path local_78;
  undefined1 local_58 [8];
  path proj_folder;
  bool base64_local;
  string *project_folder_local;
  string *licenseName_local;
  License *this_local;
  
  this->_vptr_License = (_func_int **)&PTR__License_00582ec0;
  std::__cxx11::string::string((string *)&this->m_private_key);
  std::__cxx11::string::string((string *)&this->m_feature_names);
  this->m_base64 = base64;
  this->m_license_fname = licenseName;
  normalize_project_path(&this->m_project_folder,project_folder);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->values_map);
  boost::filesystem::path::path((path *)local_58,&this->m_project_folder);
  boost::filesystem::path::filename();
  psVar1 = boost::filesystem::path::string_abi_cxx11_(&local_78);
  std::__cxx11::string::operator=((string *)&this->m_feature_names,(string *)psVar1);
  boost::filesystem::path::~path(&local_78);
  boost::filesystem::path::path(&local_b8,"private_key.rsa");
  boost::filesystem::operator/(&local_98,(path *)local_58,&local_b8);
  psVar1 = boost::filesystem::path::string_abi_cxx11_(&local_98);
  std::__cxx11::string::operator=((string *)&this->m_private_key,(string *)psVar1);
  boost::filesystem::path::~path(&local_98);
  boost::filesystem::path::~path(&local_b8);
  boost::filesystem::path::~path((path *)local_58);
  return;
}

Assistant:

License::License(const std::string *licenseName, const std::string &project_folder, bool base64)
	: m_base64(base64), m_license_fname(licenseName), m_project_folder(normalize_project_path(project_folder)) {
	fs::path proj_folder(m_project_folder);
	// default feature = project name
	m_feature_names = proj_folder.filename().string();
	m_private_key = (proj_folder / PRIVATE_KEY_FNAME).string();
}